

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_reflect_construct(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue new_target_00;
  JSValue func_obj;
  int iVar1;
  JSValue *tab_00;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar2;
  uint32_t len;
  JSValue ret;
  JSValue *tab;
  JSValue new_target;
  JSValue array_arg;
  JSValue func;
  JSContext *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68 [16];
  undefined1 auVar3 [12];
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValue *argv_00;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  auVar3 = in_stack_ffffffffffffff68._4_12_;
  argv_00 = *(JSValue **)(in_R8 + 0x18);
  if ((in_ECX < 3) || (iVar1 = JS_IsConstructor(in_RDI,*(JSValue *)(in_R8 + 0x20)), iVar1 != 0)) {
    JVar2.tag = in_RDX;
    JVar2.u.float64 = in_RSI.float64;
    tab_00 = build_arg_list(in_RDI,(uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),JVar2);
    if (tab_00 == (JSValue *)0x0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
    }
    else {
      func_obj.tag = (int64_t)tab_00;
      func_obj.u.float64 = in_stack_ffffffffffffff88.float64;
      new_target_00.tag = in_stack_ffffffffffffff80;
      new_target_00.u.float64 = in_stack_ffffffffffffff78.float64;
      JVar2 = JS_CallConstructor2(auVar3._4_8_,func_obj,new_target_00,auVar3._0_4_,argv_00);
      local_10 = JVar2.u;
      local_8 = JVar2.tag;
      free_arg_list(in_stack_ffffffffffffff60,tab_00,0);
    }
  }
  else {
    _local_10 = JS_ThrowTypeError(in_RDI,"not a constructor");
  }
  return _local_10;
}

Assistant:

static JSValue js_reflect_construct(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst func, array_arg, new_target;
    JSValue *tab, ret;
    uint32_t len;

    func = argv[0];
    array_arg = argv[1];
    if (argc > 2) {
        new_target = argv[2];
        if (!JS_IsConstructor(ctx, new_target))
            return JS_ThrowTypeError(ctx, "not a constructor");
    } else {
        new_target = func;
    }
    tab = build_arg_list(ctx, &len, array_arg);
    if (!tab)
        return JS_EXCEPTION;
    ret = JS_CallConstructor2(ctx, func, new_target, len, (JSValueConst *)tab);
    free_arg_list(ctx, tab, len);
    return ret;
}